

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_disto.c
# Opt level: O0

double SSIMCalculation(VP8DistoStats *stats,uint32_t N)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long local_88;
  double r;
  uint64_t fden;
  uint64_t fnum;
  uint64_t den_S;
  uint64_t num_S;
  uint64_t syy;
  uint64_t sxx;
  int64_t sxy;
  int64_t xmym;
  uint64_t ymym;
  uint64_t xmxm;
  uint32_t C3;
  uint32_t C2;
  uint32_t C1;
  uint32_t w2;
  uint32_t N_local;
  VP8DistoStats *stats_local;
  
  iVar1 = N * N;
  lVar2 = (ulong)stats->xm * (ulong)stats->xm;
  lVar3 = (ulong)stats->ym * (ulong)stats->ym;
  if ((ulong)(lVar2 + lVar3) < (ulong)(uint)(iVar1 * 0x40)) {
    stats_local = (VP8DistoStats *)0x3ff0000000000000;
  }
  else {
    lVar4 = (ulong)stats->xm * (ulong)stats->ym;
    local_88 = (ulong)stats->xym * (ulong)N - lVar4;
    if (local_88 < 0) {
      local_88 = 0;
    }
    lVar4 = ((ulong)(uint)(iVar1 * 0x14) + lVar4 * 2) *
            ((ulong)(uint)(iVar1 * 0x3c) + local_88 * 2 >> 8);
    lVar2 = (lVar2 + lVar3 + (ulong)(uint)(iVar1 * 0x14)) *
            (((ulong)stats->xxm * (ulong)N - lVar2) + ((ulong)stats->yym * (ulong)N - lVar3) +
             (ulong)(uint)(iVar1 * 0x3c) >> 8);
    auVar5._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = 0x45300000;
    auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar6._0_8_ = lVar2;
    auVar6._12_4_ = 0x45300000;
    stats_local = (VP8DistoStats *)
                  (((auVar5._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) /
                  ((auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)));
  }
  return (double)stats_local;
}

Assistant:

static WEBP_INLINE double SSIMCalculation(const DistoStats* const stats) {
  const uint32_t N = stats->w;
  const uint32_t w2 =  N * N;
  const uint32_t C1 = 20 * w2;
  const uint32_t C2 = 60 * w2;
  const uint32_t C3 = 8 * 8 * w2;   // 'dark' limit ~= 6
  const uint64_t xmxm = (uint64_t)stats->xm * stats->xm;
  const uint64_t ymym = (uint64_t)stats->ym * stats->ym;
  if (xmxm + ymym >= C3) {
    const int64_t xmym = (int64_t)stats->xm * stats->ym;
    const int64_t sxy = (int64_t)stats->xym * N - xmym;    // can be negative
    const uint64_t sxx = (uint64_t)stats->xxm * N - xmxm;
    const uint64_t syy = (uint64_t)stats->yym * N - ymym;
    // we descale by 8 to prevent overflow during the fnum/fden multiply.
    const uint64_t num_S = (2 * (uint64_t)(sxy < 0 ? 0 : sxy) + C2) >> 8;
    const uint64_t den_S = (sxx + syy + C2) >> 8;
    const uint64_t fnum = (2 * xmym + C1) * num_S;
    const uint64_t fden = (xmxm + ymym + C1) * den_S;
    const double r = (double)fnum / fden;
    assert(r >= 0. && r <= 1.0);
    return r;
  }
  return 1.;   // area is too dark to contribute meaningfully
}